

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  char cVar4;
  ushort uVar5;
  bool bVar6;
  uint uVar7;
  ImDrawList *pIVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  size_t sVar15;
  void *pvVar16;
  char *pcVar17;
  ImFontGlyph *pIVar18;
  char *pcVar19;
  char *pcVar20;
  ImDrawIdx IVar21;
  char *text_end_00;
  char *pcVar22;
  char *in_text;
  float scale;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float in_XMM1_Dc;
  float fVar27;
  float in_XMM1_Dd;
  float fVar28;
  float fVar29;
  float x1;
  uint c;
  float local_a8;
  uint local_90;
  uint local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  ulong local_60;
  ImDrawVert *local_58;
  ImDrawIdx *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  ImDrawList *local_38;
  
  local_78._0_4_ = pos.x;
  local_78._4_4_ = pos.y;
  local_38 = draw_list;
  if (text_end == (char *)0x0) {
    fStack_70 = in_XMM1_Dc;
    local_78 = (undefined1  [8])pos;
    fStack_6c = in_XMM1_Dd;
    sVar15 = strlen(text_begin);
    text_end = text_begin + sVar15;
    in_XMM1_Dc = fStack_70;
    in_XMM1_Dd = fStack_6c;
  }
  local_88 = (float)(int)(float)local_78._4_4_;
  fVar24 = (float)(int)(float)local_78._4_4_;
  fVar25 = (float)(int)(float)local_78._4_4_;
  fVar26 = (float)(int)(float)local_78._4_4_;
  fVar29 = clip_rect->w;
  if (local_88 <= fVar29) {
    scale = size / this->FontSize;
    fVar28 = this->FontSize * scale;
    fStack_70 = in_XMM1_Dc;
    fStack_6c = in_XMM1_Dd;
    fStack_84 = fVar24;
    fStack_80 = fVar25;
    fStack_7c = fVar26;
    if (wrap_width <= 0.0) {
      fVar23 = local_88 + fVar28;
      fVar27 = clip_rect->y;
      if ((fVar23 < fVar27) && (text_begin < text_end && fVar23 < fVar27)) {
        do {
          local_88 = fVar23;
          fStack_84 = fVar24;
          fStack_80 = fVar25;
          fStack_7c = fVar26;
          pvVar16 = memchr(text_begin,10,(long)text_end - (long)text_begin);
          text_begin = (char *)((long)pvVar16 + 1);
          if (pvVar16 == (void *)0x0) {
            text_begin = text_end;
          }
          fVar24 = 0.0;
          fVar25 = 0.0;
          fVar26 = 0.0;
          fVar23 = fVar28 + local_88;
        } while ((fVar23 < fVar27) && (text_begin < text_end));
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar17 = text_begin, fVar24 = local_88, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar17, fVar24 < fVar29 && (pcVar17 < text_end))) {
        pvVar16 = memchr(pcVar17,10,(long)text_end - (long)pcVar17);
        pcVar17 = (char *)((long)pvVar16 + 1);
        if (pvVar16 == (void *)0x0) {
          pcVar17 = text_end;
        }
        fVar24 = fVar24 + fVar28;
      }
    }
    pIVar8 = local_38;
    if (text_begin != text_end_00) {
      local_78._4_4_ = (float)(int)(float)local_78._4_4_;
      local_78._0_4_ = (float)(int)(float)local_78._0_4_;
      fStack_70 = (float)(int)fStack_70;
      fStack_6c = (float)(int)fStack_6c;
      iVar14 = (int)text_end_00 - (int)text_begin;
      local_40 = iVar14 * 6;
      local_3c = (local_38->IdxBuffer).Size;
      ImDrawList::PrimReserve(local_38,local_40,iVar14 * 4);
      local_58 = pIVar8->_VtxWritePtr;
      local_50 = pIVar8->_IdxWritePtr;
      local_60 = (ulong)pIVar8->_VtxCurrentIdx;
      local_44 = col | 0xffffff;
      local_a8 = (float)local_78._0_4_;
      pcVar17 = (char *)0x0;
      fVar29 = (float)local_78._0_4_;
      fVar24 = (float)local_78._0_4_;
      fVar25 = local_88;
      fVar26 = fStack_84;
      fVar27 = fStack_80;
      fVar23 = fStack_7c;
      local_90 = col;
      pcVar22 = text_begin;
      pcVar19 = (char *)0x0;
joined_r0x00134b53:
      do {
        if (text_end_00 <= text_begin) break;
        pcVar20 = pcVar19;
        in_text = pcVar22;
        fVar9 = local_a8;
        fVar10 = local_88;
        fVar11 = fStack_84;
        fVar12 = fStack_80;
        fVar13 = fStack_7c;
        if (0.0 < wrap_width) {
          if (pcVar17 == (char *)0x0) {
            pcVar17 = CalcWordWrapPositionA
                                (this,scale,text_begin,text_end_00,(fVar29 - fVar24) + wrap_width);
            fVar26 = 0.0;
            fVar27 = 0.0;
            fVar23 = 0.0;
            pcVar17 = pcVar17 + (pcVar17 == text_begin);
            fVar29 = (float)local_78._0_4_;
          }
          pcVar20 = pcVar17;
          in_text = text_begin;
          fVar9 = fVar24;
          fVar10 = fVar25;
          fVar11 = fVar26;
          fVar12 = fVar27;
          fVar13 = fVar23;
          if (pcVar17 <= text_begin) {
            do {
              if (text_end_00 <= text_begin) break;
              cVar4 = *text_begin;
              text_begin = text_begin + ((byte)(cVar4 - 9U) < 2 || cVar4 == ' ');
            } while ((cVar4 == ' ') || (cVar4 == '\t'));
            pcVar17 = (char *)0x0;
            fVar24 = fVar29;
            fVar25 = fVar25 + fVar28;
            goto joined_r0x00134b53;
          }
        }
        fStack_7c = fVar13;
        fStack_80 = fVar12;
        fStack_84 = fVar11;
        local_88 = fVar10;
        local_a8 = fVar9;
        local_8c = (uint)*in_text;
        if (*in_text < '\0') {
          iVar14 = ImTextCharFromUtf8(&local_8c,in_text,text_end_00);
          text_begin = in_text + iVar14;
          fVar29 = (float)local_78._0_4_;
          if (local_8c != 0) goto LAB_00134c7e;
          bVar6 = true;
        }
        else {
          text_begin = in_text + 1;
LAB_00134c7e:
          if (local_8c < 0x20) {
            if (local_8c != 0xd) {
              if (local_8c == 10) {
                local_88 = local_88 + fVar28;
                bVar6 = clip_rect->w <= local_88 && local_88 != clip_rect->w;
                local_a8 = fVar29;
                goto LAB_00134e27;
              }
              goto LAB_00134cb7;
            }
          }
          else {
LAB_00134cb7:
            if (((local_8c & 0xffff) < (uint)(this->IndexLookup).Size) &&
               (uVar5 = (this->IndexLookup).Data[(ushort)local_8c], uVar5 != 0xffff)) {
              pIVar18 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar5 * 0x28);
            }
            else {
              pIVar18 = this->FallbackGlyph;
            }
            if (pIVar18 != (ImFontGlyph *)0x0) {
              fVar24 = pIVar18->AdvanceX;
              if (((((undefined1  [40])*pIVar18 & (undefined1  [40])0x2) != (undefined1  [40])0x0)
                  && (fVar25 = local_a8 + 1.0, local_a8 <= clip_rect->z)) &&
                 (clip_rect->x <= fVar25)) {
                fVar26 = local_88 + -0.5;
                local_90 = local_8c << 0x18 | local_90 & 0xffffff;
                uVar7 = local_44;
                if (((undefined1  [40])*pIVar18 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
                  uVar7 = local_90;
                }
                IVar21 = (ImDrawIdx)local_60;
                *local_50 = IVar21;
                local_50[1] = IVar21 + 1;
                local_50[2] = IVar21 + 2;
                local_50[3] = IVar21;
                local_50[4] = IVar21 + 2;
                local_50[5] = IVar21 + 3;
                (local_58->pos).x = local_a8;
                (local_58->pos).y = fVar26;
                local_58->col = uVar7;
                IVar2.x = pIVar18->U0;
                IVar2.y = pIVar18->V0;
                local_58[1].pos.x = fVar25;
                local_58[1].pos.y = fVar26;
                local_58[1].col = uVar7;
                local_58[1].uv.y = IVar2.y;
                local_58[2].pos.x = fVar25;
                local_58[2].pos.y = fVar26;
                local_58[2].col = uVar7;
                IVar3.x = pIVar18->U1;
                IVar3.y = pIVar18->V1;
                local_58->uv = IVar2;
                local_58[1].uv.x = IVar3.x;
                local_58[2].uv = IVar3;
                local_58[3].pos.x = local_a8;
                local_58[3].pos.y = fVar26;
                local_58[3].col = uVar7;
                local_58[3].uv.x = IVar2.x;
                local_58[3].uv.y = IVar3.y;
                local_58 = local_58 + 4;
                local_60 = (ulong)((int)local_60 + 4);
                local_50 = local_50 + 6;
              }
              local_a8 = local_a8 + fVar24 * scale;
            }
          }
          bVar6 = false;
        }
LAB_00134e27:
        pcVar17 = pcVar20;
        fVar24 = local_a8;
        fVar25 = local_88;
        fVar26 = fStack_84;
        fVar27 = fStack_80;
        fVar23 = fStack_7c;
        pcVar22 = text_begin;
        pcVar19 = pcVar20;
      } while (!bVar6);
      (local_38->VtxBuffer).Size =
           (int)((ulong)((long)local_58 - (long)(local_38->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar14 = (int)((ulong)((long)local_50 - (long)(local_38->IdxBuffer).Data) >> 1);
      (local_38->IdxBuffer).Size = iVar14;
      puVar1 = &(local_38->CmdBuffer).Data[(long)(local_38->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar14 - (local_3c + local_40));
      local_38->_VtxWritePtr = local_58;
      local_38->_IdxWritePtr = local_50;
      local_38->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x;
            float x2 = x + 1.0;
            float y1 = y - 0.5f;
            float y2 = y - 0.5f;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (false && cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                col &= 0x00FFFFFF;
                col |= (c << 24);
                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}